

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void finish(lda *ld)

{
  std::_Vector_base<index_feature,_std::allocator<index_feature>_>::~_Vector_base
            (&(ld->sorted_features).
              super__Vector_base<index_feature,_std::allocator<index_feature>_>);
  v_array<float>::delete_v(&ld->Elogtheta);
  v_array<float>::delete_v(&ld->decay_levels);
  v_array<float>::delete_v(&ld->total_new);
  v_array<example_*>::delete_v(&ld->examples);
  v_array<float>::delete_v(&ld->total_lambda);
  v_array<int>::delete_v(&ld->doc_lengths);
  v_array<float>::delete_v(&ld->digammas);
  v_array<float>::delete_v(&ld->v);
  return;
}

Assistant:

void finish(lda &ld)
{
  ld.sorted_features.~vector<index_feature>();
  ld.Elogtheta.delete_v();
  ld.decay_levels.delete_v();
  ld.total_new.delete_v();
  ld.examples.delete_v();
  ld.total_lambda.delete_v();
  ld.doc_lengths.delete_v();
  ld.digammas.delete_v();
  ld.v.delete_v();
}